

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O1

void __thiscall
Am_Drawonable_Impl::Draw_Image
          (Am_Drawonable_Impl *this,int left,int top,int width,int height,Am_Image_Array *image,
          int i_left,int i_top,Am_Style *ls,Am_Style *fs,bool draw_monochrome,Am_Draw_Function f)

{
  uint *puVar1;
  Am_Generic_Image *pAVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  Pixmap PVar6;
  GC p_Var7;
  Window WVar8;
  Display *pDVar9;
  Am_Image_Array_Data *this_00;
  int local_44;
  int local_40;
  int local_3c;
  Pixmap local_38;
  
  this_00 = image->data;
  local_3c = top;
  if (this_00 == (Am_Image_Array_Data *)0x0) {
LAB_00277697:
    this_00 = (Am_Image_Array_Data *)0x0;
  }
  else {
    puVar1 = &(this_00->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    iVar5 = (**(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type)
                      (this_00);
    if ((Am_ID_Tag)iVar5 != Am_Image_Array_Data::id) goto LAB_00277697;
  }
  if (this_00 == (Am_Image_Array_Data *)0x0) {
    return;
  }
  local_38 = Am_Image_Array_Data::Get_X_Pixmap(this_00,this);
  iVar5 = height;
  iVar3 = width;
  if (width < 0) {
    (*(this->super_Am_Drawonable)._vptr_Am_Drawonable[0x16])(this,image,&local_40);
    iVar5 = local_44;
    iVar3 = local_40;
  }
  local_40 = iVar3;
  local_44 = iVar5;
  pAVar2 = this_00->image_;
  if ((pAVar2 == (Am_Generic_Image *)0x0) || ((pAVar2->iminfo).depth < 2)) {
    bVar4 = Am_Style::Valid(fs);
    if (bVar4) {
      set_gc_using_fill(this,fs,f,0);
      XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,left,local_3c,
                     local_40,local_44);
    }
    bVar4 = Am_Style::Valid(ls);
    PVar6 = local_38;
    if (!bVar4) {
      return;
    }
LAB_002777b6:
    set_gc_using_fill(this,ls,f,PVar6);
    iVar5 = local_3c;
    XSetTSOrigin(this->screen->display,this->screen->gc,left,local_3c);
  }
  else {
    if (f == Am_DRAW_MASK_COPY) {
      bVar4 = Am_Style::Valid(fs);
      if (bVar4) {
        set_gc_using_fill(this,fs,Am_DRAW_MASK_COPY,0);
        WVar8 = this->xlib_drawable;
        pDVar9 = this->screen->display;
        p_Var7 = this->screen->gc;
        iVar5 = local_3c;
        goto LAB_002777fa;
      }
      PVar6 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
      f = Am_DRAW_MASK_COPY;
      goto LAB_002777b6;
    }
    if (!draw_monochrome) {
      if ((pAVar2 == (Am_Generic_Image *)0x0) || ((pAVar2->iminfo).transparent != true)) {
        set_gc_using_fill(this,&Am_No_Style,f,0);
        WVar8 = this->xlib_drawable;
        pDVar9 = this->screen->display;
        p_Var7 = this->screen->gc;
        iVar5 = local_3c;
      }
      else {
        PVar6 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
        iVar5 = local_3c;
        XSetTSOrigin(this->screen->display,this->screen->gc,left);
        bVar4 = Am_Style::Valid(fs);
        if (bVar4) {
          set_gc_using_fill(this,fs,f,0);
          XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,left,iVar5,
                         local_40,local_44);
        }
        set_gc_using_fill(this,&Am_On_Bits,Am_DRAW_GRAPHIC_OR,PVar6);
        XSetTSOrigin(this->screen->display,this->screen->gc,left,iVar5);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,left,iVar5,
                       local_40,local_44);
        set_gc_using_fill(this,&Am_No_Style,Am_DRAW_GRAPHIC_AND,0);
        WVar8 = this->xlib_drawable;
        pDVar9 = this->screen->display;
        p_Var7 = this->screen->gc;
      }
      XCopyArea(pDVar9,local_38,WVar8,p_Var7,0,0,local_40,local_44,left,iVar5);
      return;
    }
    bVar4 = Am_Style::Valid(ls);
    if (!bVar4) {
      bVar4 = Am_Style::Valid(fs);
      if (!bVar4) {
        return;
      }
      PVar6 = Am_Image_Array_Data::Get_X_Mask(this_00,this,true);
      iVar5 = local_3c;
      XSetTSOrigin(this->screen->display,this->screen->gc,left,local_3c);
      set_gc_using_fill(this,fs,f,PVar6);
      WVar8 = this->xlib_drawable;
      pDVar9 = this->screen->display;
      p_Var7 = this->screen->gc;
      goto LAB_002777fa;
    }
    PVar6 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
    iVar5 = local_3c;
    XSetTSOrigin(this->screen->display,this->screen->gc,left);
    bVar4 = Am_Style::Valid(fs);
    if (bVar4) {
      set_gc_using_fill(this,fs,f,0);
      XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,left,iVar5,local_40,
                     local_44);
    }
    set_gc_using_fill(this,ls,f,PVar6);
  }
  WVar8 = this->xlib_drawable;
  pDVar9 = this->screen->display;
  p_Var7 = this->screen->gc;
LAB_002777fa:
  XFillRectangle(pDVar9,WVar8,p_Var7,left,iVar5,local_40,local_44);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Image(
    int left, int top, int width, int height, const Am_Image_Array &image,
    int i_left, int i_top,
    const Am_Style &ls,   // color of 'on' bits
    const Am_Style &fs,   // background behind image
    bool draw_monochrome, // use ls and fs in place of colors
    Am_Draw_Function f)
{
  int i_width, i_height;

  Am_Image_Array_Data *image_data = Am_Image_Array_Data::Narrow(image);
  if (!image_data) {
    return;
  }

  Pixmap pixmap = image_data->Get_X_Pixmap(this);

  if (width < 0) {
    Get_Image_Size(image, i_width, i_height);
  } else {
    i_width = width;
    i_height = height;
  }

  int depth = image_data->Get_Depth();
  if (depth > 1) {
    if (f == Am_DRAW_MASK_COPY) {
      if (fs.Valid()) {
        set_gc_using_fill(fs, f);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);
      } else {
        Pixmap mask = image_data->Get_X_Mask(this);
        set_gc_using_fill(ls, f, mask);
        XSetTSOrigin(screen->display, screen->gc, left, top);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);
      }
    } else {
      if (draw_monochrome) {
        if (ls.Valid()) {
          Pixmap mask = image_data->Get_X_Mask(this);

          XSetTSOrigin(screen->display, screen->gc, left, top);
          if (fs.Valid()) {
            set_gc_using_fill(fs, f);
            XFillRectangle(screen->display, xlib_drawable, screen->gc, left,
                           top, i_width, i_height);
          }

          set_gc_using_fill(ls, f, mask);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        } else if (fs.Valid()) {
          // foreground transparent; background not transparent
          // use inverted mask
          Pixmap mask = image_data->Get_X_Mask(this, true);

          XSetTSOrigin(screen->display, screen->gc, left, top);
          set_gc_using_fill(fs, f, mask);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        }
      } else if (image_data->Is_Transparent()) {
        Pixmap mask = image_data->Get_X_Mask(this);
        XSetTSOrigin(screen->display, screen->gc, left, top);

        if (fs.Valid()) { // use fs to fill background
          set_gc_using_fill(fs, f);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        }

        set_gc_using_fill(Am_On_Bits, Am_DRAW_GRAPHIC_OR, mask);
        XSetTSOrigin(screen->display, screen->gc, left, top);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);

        set_gc_using_fill(Am_No_Style, Am_DRAW_GRAPHIC_AND);
        XCopyArea(screen->display, pixmap, xlib_drawable, screen->gc, 0, 0,
                  i_width, i_height, left, top);
      } else { // opaque
        set_gc_using_fill(Am_No_Style, f);
        XCopyArea(screen->display, pixmap, xlib_drawable, screen->gc, 0, 0,
                  i_width, i_height, left, top);
      }
    }
  } else { // bitmap (depth == 1), might be transparent.
    // The idea of transparent and opaque bitmaps is implemented here, but it
    // is not through the fill-flag of any style object.  The way to make a
    // bitmap transparent is to just not pass any fill-style.  If a fill-style
    // is passed, the bitmap will be opaque (i.e., the 'off' bits will be
    // drawn with the color of the fill-style).
    // 4-18-97 eab
    // I have left old behavior in place for bitmaps
    // draw_monochrome requires masking that I haven't been able to get
    // working for bitmaps (xbm files, nameless images)
    // I may be mistaken, but it appears that some nameless images of
    // depth 1 may be stored one pixel per byte and others one pixel
    // per bit!!!
    if (fs.Valid()) {
      set_gc_using_fill(fs, f);
      XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                     i_width, i_height);
    }

    if (ls.Valid()) {
      set_gc_using_fill(ls, f, pixmap);
      XSetTSOrigin(screen->display, screen->gc, left, top);
      XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                     i_width, i_height);
    }
  }
}